

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

int __thiscall QSocks5SocketEngine::listen(QSocks5SocketEngine *this,int __fd,int __n)

{
  QSocks5SocketEnginePrivate *this_00;
  QSocks5SocketEnginePrivate *extraout_RAX;
  QSocks5SocketEnginePrivate *d;
  undefined1 local_1;
  
  this_00 = d_func((QSocks5SocketEngine *)0x3738db);
  if ((this_00->super_QAbstractSocketEnginePrivate).socketState == BoundState) {
    (this_00->super_QAbstractSocketEnginePrivate).socketState = ListeningState;
    if (this_00->socks5State == BindSuccess) {
      QSocks5SocketEnginePrivate::emitReadNotification(this_00);
      this_00 = extraout_RAX;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  return (int)CONCAT71((int7)((ulong)this_00 >> 8),local_1);
}

Assistant:

bool QSocks5SocketEngine::listen(int backlog)
{
    Q_D(QSocks5SocketEngine);
    Q_UNUSED(backlog);

    QSOCKS5_Q_DEBUG << "listen()";

    // check that we are in bound and then go to listening.
    if (d->socketState == QAbstractSocket::BoundState) {
        d->socketState = QAbstractSocket::ListeningState;

        // check if we already have a connection
        if (d->socks5State == QSocks5SocketEnginePrivate::BindSuccess)
            d->emitReadNotification();

        return true;
    }
    return false;
}